

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS5837.cpp
# Opt level: O1

void * MS5837Thread(void *pParam)

{
  undefined1 auVar1 [16];
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  double dVar8;
  size_t sVar9;
  uint uVar10;
  uint uVar11;
  double *pdVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  char *pcVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  double dVar19;
  float temperature;
  CHRONO chrono_filter;
  CHRONO chrono_period;
  char szTemp [256];
  char szSaveFilePath [256];
  interval local_a60;
  int local_a48;
  int local_a44;
  timespec local_a40;
  double local_a30;
  double dStack_a28;
  double local_a20;
  double dStack_a18;
  timespec local_a10;
  int local_a00;
  undefined1 local_9f8 [16];
  timespec local_9e0;
  double local_9d0;
  double dStack_9c8;
  double local_9c0;
  double dStack_9b8;
  timespec local_9b0;
  int local_9a0;
  undefined1 local_998 [16];
  double local_980;
  double local_978;
  interval local_970;
  double local_958;
  double dStack_950;
  interval local_940;
  char local_928 [264];
  MS5837 local_820;
  char local_138 [264];
  
  memset(&local_820,0,0x6e8);
  iVar4 = clock_getres(4,&local_a10);
  if ((iVar4 == 0) && (iVar4 = clock_gettime(4,&local_a40), iVar4 == 0)) {
    local_a00 = 0;
    local_a30 = 0.0;
    dStack_a28 = 0.0;
    local_a20 = 0.0;
    dStack_a18 = 0.0;
  }
  iVar4 = clock_getres(4,&local_9b0);
  if ((iVar4 == 0) && (iVar4 = clock_gettime(4,&local_9e0), iVar4 == 0)) {
    local_9a0 = 0;
    local_9d0 = 0.0;
    dStack_9c8 = 0.0;
    local_9c0 = 0.0;
    dStack_9b8 = 0.0;
  }
  iVar4 = 0x32;
  local_998 = ZEXT816(0);
  bVar2 = false;
  local_a48 = 0;
  do {
    local_a44 = iVar4;
    while( true ) {
      if (local_9a0 == 0) {
        clock_gettime(4,(timespec *)&local_a60);
        local_9d0 = local_a60.inf;
        dStack_9c8 = local_a60.sup;
        local_a60.inf =
             (double)(((long)local_a60.inf + (long)local_9c0 +
                      ((long)local_a60.sup + (long)dStack_9b8) / 1000000000) - local_9e0.tv_sec);
        local_a60.sup =
             (double)(((long)local_a60.sup + (long)dStack_9b8) % 1000000000 - local_9e0.tv_nsec);
        if ((long)local_a60.sup < 0) {
          local_a60.inf = (double)(((long)local_a60.inf + (long)local_a60.sup / 1000000000) - 1);
          local_a60.sup = (double)((long)local_a60.sup % 1000000000 + 1000000000);
        }
        local_9c0 = local_a60.inf;
        dStack_9b8 = local_a60.sup;
      }
      iVar5 = clock_getres(4,&local_9b0);
      if ((iVar5 == 0) && (iVar5 = clock_gettime(4,&local_9e0), iVar5 == 0)) {
        local_9a0 = 0;
        local_9c0 = 0.0;
        dStack_9b8 = 0.0;
        local_9d0 = 0.0;
        dStack_9c8 = 0.0;
      }
      local_a60.inf = (double)((long)iVar4 / 1000);
      local_a60.sup = (double)(((long)iVar4 % 1000) * 1000000);
      nanosleep((timespec *)&local_a60,(timespec *)0x0);
      iVar5 = local_a44;
      if (bPauseMS5837 == 0) break;
      if (bVar2) {
        puts("MS5837 paused.");
        if (local_820.I2CBus.DevType == 0) {
          iVar5 = close((int)local_820.I2CBus.hDev);
          uVar6 = (uint)(iVar5 != 0);
        }
        else {
          uVar6 = 1;
          if (local_820.I2CBus.DevType == 1) {
            uVar6 = CloseRS232Port(&local_820.I2CBus.RS232Port);
          }
        }
        pcVar16 = "MS5837 disconnection failed.";
        if (uVar6 == 0) {
          pcVar16 = "MS5837 disconnected.";
        }
        puts(pcVar16);
      }
      if (bExit != 0) {
        bVar3 = true;
        goto LAB_001be9d6;
      }
      local_a60.inf = 0.0;
      local_a60.sup = 4.94065645841247e-316;
      bVar2 = false;
      nanosleep((timespec *)&local_a60,(timespec *)0x0);
    }
    if (bRestartMS5837 != 0) {
      if (bVar2) {
        puts("Restarting a MS5837.");
        if (local_820.I2CBus.DevType == 0) {
          iVar4 = close((int)local_820.I2CBus.hDev);
          uVar6 = (uint)(iVar4 != 0);
        }
        else {
          uVar6 = 1;
          if (local_820.I2CBus.DevType == 1) {
            uVar6 = CloseRS232Port(&local_820.I2CBus.RS232Port);
          }
        }
        pcVar16 = "MS5837 disconnection failed.";
        if (uVar6 == 0) {
          pcVar16 = "MS5837 disconnected.";
        }
        puts(pcVar16);
      }
      bRestartMS5837 = 0;
      bVar2 = false;
    }
    if (bVar2) {
      local_a60.inf = (double)((ulong)local_a60.inf & 0xffffffff00000000);
      local_970.inf._0_4_ = 0.0;
      iVar4 = ms5837_read_temperature_and_pressure
                        (&local_820,(float *)&local_a60,(float *)&local_970);
      if (iVar4 == 0) {
        local_820.LastMS5837Data.temperature = (double)local_a60.inf._0_4_;
        local_820.LastMS5837Data.pressure = (double)local_970.inf._0_4_;
        local_820.LastMS5837Data.Pressure = local_820.LastMS5837Data.pressure / 1000.0;
        local_820.LastMS5837Data.depth = local_958;
        local_820.LastMS5837Data.altitude = dStack_950;
        local_9f8._8_4_ = in_XMM1_Dc;
        local_9f8._0_8_ = local_820.LastMS5837Data.Pressure;
        local_9f8._12_4_ = in_XMM1_Dd;
        pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        pressure_mes = (double)local_9f8._0_8_;
        if (local_a00 == 0) {
          clock_gettime(4,(timespec *)&local_a60);
          local_a60.inf =
               (double)(((long)local_a60.inf + (long)local_a20 +
                        ((long)local_a60.sup + (long)dStack_a18) / 1000000000) - local_a40.tv_sec);
          local_a60.sup =
               (double)(((long)local_a60.sup + (long)dStack_a18) % 1000000000 - local_a40.tv_nsec);
          if ((long)local_a60.sup < 0) {
            local_a60.inf = (double)(((long)local_a60.inf + (long)local_a60.sup / 1000000000) - 1);
            local_a60.sup = (double)((long)local_a60.sup % 1000000000 + 1000000000);
          }
          pdVar12 = &local_a60.sup;
          dVar8 = local_a60.inf;
          dVar19 = (double)local_9f8._0_8_;
          uVar14 = local_9f8._8_8_;
        }
        else {
          pdVar12 = &dStack_a18;
          dVar8 = local_a20;
          dVar19 = (double)local_9f8._0_8_;
          uVar14 = local_9f8._8_8_;
        }
        if (2.0 < (double)(long)*pdVar12 / 1000000000.0 + (double)(long)dVar8) {
          if (local_a00 == 0) {
            clock_gettime(4,(timespec *)&local_a60);
            local_a60.inf =
                 (double)(((long)local_a60.inf + (long)local_a20 +
                          ((long)local_a60.sup + (long)dStack_a18) / 1000000000) - local_a40.tv_sec)
            ;
            local_a60.sup =
                 (double)(((long)local_a60.sup + (long)dStack_a18) % 1000000000 - local_a40.tv_nsec)
            ;
            if ((long)local_a60.sup < 0) {
              local_a60.inf = (double)(((long)local_a60.inf + (long)local_a60.sup / 1000000000) - 1)
              ;
              local_a60.sup = (double)((long)local_a60.sup % 1000000000 + 1000000000);
            }
            pdVar12 = &local_a60.sup;
            dVar8 = local_a60.inf;
            dVar19 = (double)local_9f8._0_8_;
            uVar14 = local_9f8._8_8_;
          }
          else {
            pdVar12 = &dStack_a18;
            dVar8 = local_a20;
          }
          if ((double)(long)*pdVar12 / 1000000000.0 + (double)(long)dVar8 <= 3.0) {
            local_998._8_8_ = uVar14;
            local_998._0_8_ = dVar19;
          }
        }
        if (local_a00 == 0) {
          clock_gettime(4,(timespec *)&local_a60);
          local_a60.inf =
               (double)(((long)local_a60.inf + (long)local_a20 +
                        ((long)local_a60.sup + (long)dStack_a18) / 1000000000) - local_a40.tv_sec);
          local_a60.sup =
               (double)(((long)local_a60.sup + (long)dStack_a18) % 1000000000 - local_a40.tv_nsec);
          if ((long)local_a60.sup < 0) {
            local_a60.inf = (double)(((long)local_a60.inf + (long)local_a60.sup / 1000000000) - 1);
            local_a60.sup = (double)((long)local_a60.sup % 1000000000 + 1000000000);
          }
          pdVar12 = &local_a60.sup;
          dVar8 = local_a60.inf;
          dVar19 = (double)local_9f8._0_8_;
          uVar14 = local_9f8._8_8_;
        }
        else {
          pdVar12 = &dStack_a18;
          dVar8 = local_a20;
        }
        if (3.0 < (double)(long)*pdVar12 / 1000000000.0 + (double)(long)dVar8) {
          uVar17 = -(ulong)(ABS(dVar19 - (double)local_998._0_8_) < 0.05);
          uVar15 = uVar14 & 0x7fffffffffffffff & uVar14;
          auVar18._0_8_ = ~uVar17 & local_998._0_8_;
          auVar18._8_8_ = ~(uVar14 & 0x7fffffffffffffff) & local_998._8_8_;
          auVar1._8_4_ = (int)uVar15;
          auVar1._0_8_ = uVar17 & (ulong)dVar19;
          auVar1._12_4_ = (int)(uVar15 >> 0x20);
          local_998 = auVar18 | auVar1;
          dVar19 = local_998._0_8_;
        }
        in_XMM1_Dc = 0;
        in_XMM1_Dd = 0;
        local_978 = ((dVar19 - local_820.PressureRef) * -100000.0) /
                    (local_820.WaterDensity * 9.80665);
        interval::interval(&local_970,&local_978);
        local_980 = -z_pressure_acc;
        interval::interval(&local_940,&local_980,&z_pressure_acc);
        operator+(&local_970,&local_940);
        interval::operator=((interval *)&z_pressure,&local_a60);
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        bVar2 = true;
        bVar3 = false;
        iVar4 = iVar5;
      }
      else {
        puts("Connection to a MS5837 lost.");
        if (local_820.I2CBus.DevType == 0) {
          iVar4 = close((int)local_820.I2CBus.hDev);
          uVar6 = (uint)(iVar4 != 0);
        }
        else {
          uVar6 = 1;
          if (local_820.I2CBus.DevType == 1) {
            uVar6 = CloseRS232Port(&local_820.I2CBus.RS232Port);
          }
        }
        if (uVar6 == 0) {
          pcVar16 = "MS5837 disconnected.";
        }
        else {
          pcVar16 = "MS5837 disconnection failed.";
        }
        puts(pcVar16);
LAB_001be4e5:
        bVar2 = false;
        bVar3 = true;
        iVar4 = iVar5;
      }
    }
    else {
      iVar7 = ConnectMS5837(&local_820,"MS58370.txt");
      iVar4 = local_820.threadperiod;
      if (iVar7 != 0) {
        local_a60.inf = 4.94065645841247e-324;
        local_a60.sup = 0.0;
        nanosleep((timespec *)&local_a60,(timespec *)0x0);
        goto LAB_001be4e5;
      }
      local_958 = 0.0;
      dStack_950 = 0.0;
      if (local_a00 == 0) {
        clock_gettime(4,(timespec *)&local_a60);
        local_a30 = local_a60.inf;
        dStack_a28 = local_a60.sup;
        local_a60.inf =
             (double)(((long)local_a60.inf + (long)local_a20 +
                      ((long)local_a60.sup + (long)dStack_a18) / 1000000000) - local_a40.tv_sec);
        local_a60.sup =
             (double)(((long)local_a60.sup + (long)dStack_a18) % 1000000000 - local_a40.tv_nsec);
        if ((long)local_a60.sup < 0) {
          local_a60.inf = (double)(((long)local_a60.inf + (long)local_a60.sup / 1000000000) - 1);
          local_a60.sup = (double)((long)local_a60.sup % 1000000000 + 1000000000);
        }
        local_a20 = local_a60.inf;
        dStack_a18 = local_a60.sup;
      }
      iVar5 = clock_getres(4,&local_a10);
      if ((iVar5 == 0) && (iVar5 = clock_gettime(4,&local_a40), iVar5 == 0)) {
        local_a00 = 0;
        local_a20 = 0.0;
        dStack_a18 = 0.0;
        local_a30 = 0.0;
        dStack_a28 = 0.0;
      }
      if ((FILE *)local_820.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)local_820.pfSaveFile);
        local_820.pfSaveFile = (FILE *)0x0;
      }
      bVar3 = false;
      bVar2 = true;
      if (local_820.bSaveRawData == 0) {
        local_9f8 = ZEXT816(0);
      }
      else if ((FILE *)local_820.pfSaveFile == (FILE *)0x0) {
        local_9f8 = ZEXT816(0);
        if (local_820.szCfgFilePath[0] == '\0') {
          builtin_strncpy(local_928,"ms5837",7);
        }
        else {
          sprintf(local_928,"%.127s",local_820.szCfgFilePath);
        }
        sVar9 = strlen(local_928);
        uVar6 = (uint)sVar9;
        uVar15 = sVar9 & 0xffffffff;
        uVar10 = (int)uVar6 >> 0x1f & uVar6;
        uVar14 = sVar9 & 0xffffffff;
        do {
          uVar15 = uVar15 - 1;
          uVar13 = (uint)uVar14;
          uVar14 = (ulong)(uVar10 - 1);
          uVar11 = uVar10;
          if ((int)uVar13 < 1) break;
          uVar14 = (ulong)(uVar13 - 1);
          uVar11 = uVar13;
        } while (local_928[uVar15 & 0xffffffff] != '.');
        if ((int)uVar11 <= (int)uVar6 && 1 < (int)uVar11) {
          memset(local_928 + uVar14,0,sVar9 - uVar14);
        }
        pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
        pcVar16 = strtimeex_fns();
        sprintf(local_138,"log/%.127s_%.64s.txt",local_928,pcVar16);
        pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
        bVar3 = false;
        local_820.pfSaveFile = (FILE *)fopen(local_138,"w");
        if ((FILE *)local_820.pfSaveFile == (FILE *)0x0) {
          puts("Unable to create MS5837 data file.");
          bVar3 = false;
          goto LAB_001be9d6;
        }
      }
      else {
        local_9f8 = ZEXT816(0);
      }
    }
    if ((bVar3) &&
       (local_a48 = local_a48 + 1, ExitOnErrorCount <= local_a48 && 0 < ExitOnErrorCount)) {
      bExit = 1;
    }
    if (bExit != 0) {
LAB_001be9d6:
      if (local_9a0 == 0) {
        clock_gettime(4,(timespec *)&local_a60);
        local_9d0 = local_a60.inf;
        dStack_9c8 = local_a60.sup;
        local_a60.inf =
             (double)(((long)local_a60.inf + (long)local_9c0 +
                      ((long)local_a60.sup + (long)dStack_9b8) / 1000000000) - local_9e0.tv_sec);
        local_a60.sup =
             (double)(((long)local_a60.sup + (long)dStack_9b8) % 1000000000 - local_9e0.tv_nsec);
        if ((long)local_a60.sup < 0) {
          local_a60.inf = (double)(((long)local_a60.inf + (long)local_a60.sup / 1000000000) - 1);
          local_a60.sup = (double)((long)local_a60.sup % 1000000000 + 1000000000);
        }
        local_9c0 = local_a60.inf;
        dStack_9b8 = local_a60.sup;
      }
      if (local_a00 == 0) {
        clock_gettime(4,(timespec *)&local_a60);
        local_a30 = local_a60.inf;
        dStack_a28 = local_a60.sup;
        local_a60.inf =
             (double)(((long)local_a60.inf + (long)local_a20 +
                      ((long)local_a60.sup + (long)dStack_a18) / 1000000000) - local_a40.tv_sec);
        local_a60.sup =
             (double)(((long)local_a60.sup + (long)dStack_a18) % 1000000000 - local_a40.tv_nsec);
        if ((long)local_a60.sup < 0) {
          local_a60.inf = (double)(((long)local_a60.inf + (long)local_a60.sup / 1000000000) - 1);
          local_a60.sup = (double)((long)local_a60.sup % 1000000000 + 1000000000);
        }
        local_a20 = local_a60.inf;
        dStack_a18 = local_a60.sup;
      }
      if ((FILE *)local_820.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)local_820.pfSaveFile);
        local_820.pfSaveFile = (FILE *)0x0;
      }
      if (!bVar3) {
        if (local_820.I2CBus.DevType == 0) {
          iVar4 = close((int)local_820.I2CBus.hDev);
          uVar6 = (uint)(iVar4 != 0);
        }
        else {
          uVar6 = 1;
          if (local_820.I2CBus.DevType == 1) {
            uVar6 = CloseRS232Port(&local_820.I2CBus.RS232Port);
          }
        }
        pcVar16 = "MS5837 disconnection failed.";
        if (uVar6 == 0) {
          pcVar16 = "MS5837 disconnected.";
        }
        puts(pcVar16);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE MS5837Thread(void* pParam)
{
	MS5837 ms5837;
	MS5837DATA ms5837data;
	double pressure_prev = 0, filteredpressure = 0;
	CHRONO chrono_filter;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 50;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&ms5837, 0, sizeof(MS5837));

	StartChrono(&chrono_filter);

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseMS5837) 
		{ 
			if (bConnected)
			{
				printf("MS5837 paused.\n");
				bConnected = FALSE;
				DisconnectMS5837(&ms5837);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartMS5837) 
		{ 
			if (bConnected)
			{
				printf("Restarting a MS5837.\n");
				bConnected = FALSE;
				DisconnectMS5837(&ms5837);
			}
			bRestartMS5837 = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectMS5837(&ms5837, "MS58370.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = ms5837.threadperiod;

				memset(&ms5837data, 0, sizeof(ms5837data));
				StopChronoQuick(&chrono_filter);
				StartChrono(&chrono_filter);

				if (ms5837.pfSaveFile != NULL)
				{
					fclose(ms5837.pfSaveFile); 
					ms5837.pfSaveFile = NULL;
				}
				if ((ms5837.bSaveRawData)&&(ms5837.pfSaveFile == NULL)) 
				{
					if (strlen(ms5837.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", ms5837.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "ms5837");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					ms5837.pfSaveFile = fopen(szSaveFilePath, "w");
					if (ms5837.pfSaveFile == NULL) 
					{
						printf("Unable to create MS5837 data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (GetLatestDataMS5837(&ms5837, &ms5837data) == EXIT_SUCCESS)
			{
				EnterCriticalSection(&StateVariablesCS);
				pressure_mes = ms5837data.Pressure;
				if ((GetTimeElapsedChronoQuick(&chrono_filter) > 2)&&(GetTimeElapsedChronoQuick(&chrono_filter) <= 3))
				{
					pressure_prev = ms5837data.Pressure; // Initialization of pressure_prev...
				}
				if (GetTimeElapsedChronoQuick(&chrono_filter) > 3)
				{
					if (fabs(ms5837data.Pressure-pressure_prev) < 0.05)
					{
						filteredpressure = ms5837data.Pressure;
						pressure_prev = filteredpressure;
					}
					else
					{
						// Ignore outlier...
						filteredpressure = pressure_prev;
					}
				}
				else
				{
					filteredpressure = ms5837data.Pressure;
				}
				z_pressure = Pressure2Height(filteredpressure, ms5837.PressureRef, ms5837.WaterDensity)+interval(-z_pressure_acc, z_pressure_acc);
				LeaveCriticalSection(&StateVariablesCS);
			}
			else
			{
				printf("Connection to a MS5837 lost.\n");
				bConnected = FALSE;
				DisconnectMS5837(&ms5837);
			}
		}

		//printf("MS5837Thread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	StopChronoQuick(&chrono_filter);

	if (ms5837.pfSaveFile != NULL)
	{
		fclose(ms5837.pfSaveFile); 
		ms5837.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectMS5837(&ms5837);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}